

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O2

void __thiscall AllReduceSockets::all_reduce_init(AllReduceSockets *this)

{
  ushort uVar1;
  socket_t sVar2;
  int __fd;
  int iVar3;
  int iVar4;
  hostent *phVar5;
  ssize_t sVar6;
  ostream *poVar7;
  int *piVar8;
  char *pcVar9;
  char *pcVar10;
  vw_exception *pvVar11;
  ostream *poVar12;
  ulong uVar13;
  unsigned_short netport;
  uint16_t kid_count;
  uint16_t parent_port;
  uint32_t parent_ip;
  int ok;
  socket_t local_360;
  socklen_t size;
  sockaddr_in address;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  stringstream __msg;
  ostream local_2b8;
  char __errmsg [256];
  
  phVar5 = gethostbyname((this->span_server)._M_dataplus._M_p);
  if (phVar5 == (hostent *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    poVar7 = &local_2b8;
    poVar12 = std::operator<<(poVar7,"gethostbyname(");
    poVar12 = std::operator<<(poVar12,(string *)&this->span_server);
    std::operator<<(poVar12,")");
    piVar8 = __errno_location();
    pcVar9 = __errmsg;
    pcVar10 = strerror_r(*piVar8,pcVar9,0x100);
    if (pcVar10 == (char *)0x0) {
      poVar7 = std::operator<<(poVar7,"errno = ");
    }
    else {
      pcVar9 = "errno = unknown";
    }
    std::operator<<(poVar7,pcVar9);
    pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar11,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
               ,0x71,&local_2e8);
    __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::__cxx11::string::_M_assign((string *)&this->socks);
  sVar2 = sock_connect(*(uint32_t *)*phVar5->h_addr_list,0xaf67);
  sVar6 = send(sVar2,&this->unique_id,8,0);
  if (sVar6 < 8) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"write unique_id=");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," to span server failed");
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"wrote unique_id=");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  }
  std::endl<char,std::char_traits<char>>(poVar7);
  sVar6 = send(sVar2,&(this->super_AllReduce).total,8,0);
  if (sVar6 < 8) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"write total=");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," to span server failed");
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"wrote total=");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  }
  std::endl<char,std::char_traits<char>>(poVar7);
  sVar6 = send(sVar2,&(this->super_AllReduce).node,8,0);
  if (sVar6 < 8) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"write node=");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," to span server failed");
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"wrote node=");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  }
  std::endl<char,std::char_traits<char>>(poVar7);
  sVar6 = recv(sVar2,&ok,4,0);
  if (sVar6 < 4) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"read ok from span server failed");
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"read ok=");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,ok);
  }
  std::endl<char,std::char_traits<char>>(poVar7);
  if (ok == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<(&local_2b8,"mapper already connected");
    pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar11,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
               ,0x8b,&local_308);
    __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  sVar6 = recv(sVar2,&kid_count,2,0);
  if (sVar6 < 2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"read kid_count from span server failed");
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"read kid_count=");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,kid_count);
  }
  std::endl<char,std::char_traits<char>>(poVar7);
  netport = 0xb067;
  if (kid_count == 0) {
    __fd = -1;
  }
  else {
    local_360 = sVar2;
    __fd = getsock();
    address.sin_family = 2;
    address.sin_addr.s_addr = 0;
    address.sin_port = netport;
LAB_00232856:
    do {
      iVar3 = bind(__fd,(sockaddr *)&address,0x10);
      if (iVar3 < 0) {
        piVar8 = __errno_location();
        if (*piVar8 != 0x62) {
          std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
          poVar7 = &local_2b8;
          std::operator<<(poVar7,"bind");
          pcVar9 = __errmsg;
          pcVar10 = strerror_r(*piVar8,pcVar9,0x100);
          if (pcVar10 == (char *)0x0) {
            poVar7 = std::operator<<(poVar7,"errno = ");
          }
          else {
            pcVar9 = "errno = unknown";
          }
          std::operator<<(poVar7,pcVar9);
          pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar11,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
                     ,0xaf,&local_328);
          __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        uVar1 = (netport << 8 | netport >> 8) + 1;
        netport = uVar1 * 0x100 | uVar1 >> 8;
        address.sin_port = netport;
      }
      else {
        iVar4 = listen(__fd,(uint)kid_count);
        if (iVar4 < 0) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"listen: ");
          piVar8 = __errno_location();
          pcVar9 = strerror(*piVar8);
          poVar7 = std::operator<<(poVar7,pcVar9);
          std::endl<char,std::char_traits<char>>(poVar7);
          close(__fd);
          __fd = getsock();
          goto LAB_00232856;
        }
      }
      sVar2 = local_360;
    } while (iVar3 < 0);
  }
  sVar6 = send(sVar2,&netport,2,0);
  if (sVar6 < 2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"write netport failed!");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  sVar6 = recv(sVar2,&parent_ip,4,0);
  if (sVar6 < 4) {
    poVar7 = (ostream *)&std::cerr;
    pcVar9 = "read parent_ip failed!";
  }
  else {
    pcVar9 = inet_ntop(2,&parent_ip,(char *)&__msg,0x10);
    poVar7 = std::operator<<((ostream *)&std::cerr,"read parent_ip=");
    if (pcVar9 == (char *)0x0) {
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7,"(inet_ntop: ");
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      poVar7 = std::operator<<(poVar7,pcVar9);
      pcVar9 = ")";
    }
    else {
      pcVar9 = (char *)&__msg;
    }
  }
  poVar7 = std::operator<<(poVar7,pcVar9);
  std::endl<char,std::char_traits<char>>(poVar7);
  sVar6 = recv(sVar2,&parent_port,2,0);
  if (sVar6 < 2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"read parent_port failed!");
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"read parent_port=");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,parent_port);
  }
  std::endl<char,std::char_traits<char>>(poVar7);
  close(sVar2);
  if (parent_ip == 0xffffffff) {
    sVar2 = -1;
  }
  else {
    sVar2 = sock_connect(parent_ip,(uint)parent_port);
  }
  (this->socks).parent = sVar2;
  (this->socks).children[0] = -1;
  (this->socks).children[1] = -1;
  uVar13 = 0;
  while( true ) {
    if (kid_count <= uVar13) {
      if (kid_count != 0) {
        close(__fd);
      }
      return;
    }
    size = 0x10;
    iVar3 = accept(__fd,(sockaddr *)&address,&size);
    if (iVar3 < 0) break;
    (this->socks).children[uVar13] = iVar3;
    uVar13 = uVar13 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  poVar7 = &local_2b8;
  std::operator<<(poVar7,"accept");
  piVar8 = __errno_location();
  pcVar9 = __errmsg;
  pcVar10 = strerror_r(*piVar8,pcVar9,0x100);
  if (pcVar10 == (char *)0x0) {
    poVar7 = std::operator<<(poVar7,"errno = ");
  }
  else {
    pcVar9 = "errno = unknown";
  }
  std::operator<<(poVar7,pcVar9);
  pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar11,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
             ,0xe6,&local_348);
  __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void AllReduceSockets::all_reduce_init()
{
#ifdef _WIN32
  WSAData wsaData;
  int lastError = WSAStartup(MAKEWORD(2, 2), &wsaData);
  if (lastError != 0)
    THROWERRNO("WSAStartup() returned error:" << lastError);
#endif

  struct hostent* master = gethostbyname(span_server.c_str());

  if (master == nullptr)
    THROWERRNO("gethostbyname(" << span_server << ")");

  socks.current_master = span_server;

  uint32_t master_ip = *((uint32_t*)master->h_addr);
  int port = 26543;

  socket_t master_sock = sock_connect(master_ip, htons(port));
  if (send(master_sock, (const char*)&unique_id, sizeof(unique_id), 0) < (int)sizeof(unique_id))
    cerr << "write unique_id=" << unique_id << " to span server failed" << endl;
  else
    cerr << "wrote unique_id=" << unique_id << endl;
  if (send(master_sock, (const char*)&total, sizeof(total), 0) < (int)sizeof(total))
    cerr << "write total=" << total << " to span server failed" << endl;
  else
    cerr << "wrote total=" << total << endl;
  if (send(master_sock, (char*)&node, sizeof(node), 0) < (int)sizeof(node))
    cerr << "write node=" << node << " to span server failed" << endl;
  else
    cerr << "wrote node=" << node << endl;
  int ok;
  if (recv(master_sock, (char*)&ok, sizeof(ok), 0) < (int)sizeof(ok))
    cerr << "read ok from span server failed" << endl;
  else
    cerr << "read ok=" << ok << endl;
  if (!ok)
    THROW("mapper already connected");

  uint16_t kid_count;
  uint16_t parent_port;
  uint32_t parent_ip;

  if (recv(master_sock, (char*)&kid_count, sizeof(kid_count), 0) < (int)sizeof(kid_count))
    cerr << "read kid_count from span server failed" << endl;
  else
    cerr << "read kid_count=" << kid_count << endl;

  socket_t sock = -1;
  short unsigned int netport = htons(26544);
  if (kid_count > 0)
  {
    sock = getsock();
    sockaddr_in address;
    address.sin_family = AF_INET;
    address.sin_addr.s_addr = htonl(INADDR_ANY);
    address.sin_port = netport;

    bool listening = false;
    while (!listening)
    {
      if (::bind(sock, (sockaddr*)&address, sizeof(address)) < 0)
      {
#ifdef _WIN32
        if (WSAGetLastError() == WSAEADDRINUSE)
#else
        if (errno == EADDRINUSE)
#endif
        {
          netport = htons(ntohs(netport) + 1);
          address.sin_port = netport;
        }
        else
          THROWERRNO("bind");
      }
      else
      {
        if (listen(sock, kid_count) < 0)
        {
          cerr << "listen: " << strerror(errno) << endl;
          CLOSESOCK(sock);
          sock = getsock();
        }
        else
        {
          listening = true;
        }
      }
    }
  }

  if (send(master_sock, (const char*)&netport, sizeof(netport), 0) < (int)sizeof(netport))
    cerr << "write netport failed!" << endl;

  if (recv(master_sock, (char*)&parent_ip, sizeof(parent_ip), 0) < (int)sizeof(parent_ip))
    cerr << "read parent_ip failed!" << endl;
  else
  {
    char dotted_quad[INET_ADDRSTRLEN];
    if (nullptr == inet_ntop(AF_INET, (char*)&parent_ip, dotted_quad, INET_ADDRSTRLEN))
    {
      cerr << "read parent_ip=" << parent_ip << "(inet_ntop: " << strerror(errno) << ")" << endl;
    }
    else
      cerr << "read parent_ip=" << dotted_quad << endl;
  }
  if (recv(master_sock, (char*)&parent_port, sizeof(parent_port), 0) < (int)sizeof(parent_port))
    cerr << "read parent_port failed!" << endl;
  else
    cerr << "read parent_port=" << parent_port << endl;

  CLOSESOCK(master_sock);

  if (parent_ip != (uint32_t)-1)
  {
    socks.parent = sock_connect(parent_ip, parent_port);
  }
  else
    socks.parent = -1;

  socks.children[0] = -1;
  socks.children[1] = -1;
  for (int i = 0; i < kid_count; i++)
  {
    sockaddr_in child_address;
    socklen_t size = sizeof(child_address);
    socket_t f = accept(sock, (sockaddr*)&child_address, &size);
    if (f < 0)
      THROWERRNO("accept");

    // char hostname[NI_MAXHOST];
    // char servInfo[NI_MAXSERV];
    // getnameinfo((sockaddr *) &child_address, sizeof(sockaddr), hostname, NI_MAXHOST, servInfo, NI_MAXSERV,
    // NI_NUMERICSERV); cerr << "connected to " << hostname << ':' << ntohs(port) << endl;
    socks.children[i] = f;
  }

  if (kid_count > 0)
    CLOSESOCK(sock);
}